

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * basicgetobjname(Proto *p,int *ppc,int reg,char **name)

{
  uint uVar1;
  int iVar2;
  uint reg_00;
  char *pcVar3;
  int b;
  OpCode op;
  Instruction i;
  int pc;
  char **name_local;
  int reg_local;
  int *ppc_local;
  Proto *p_local;
  
  iVar2 = *ppc;
  pcVar3 = luaF_getlocalname(p,reg + 1,iVar2);
  *name = pcVar3;
  if (*name != (char *)0x0) {
    p_local = (Proto *)anon_var_dwarf_4ca0;
    return (char *)p_local;
  }
  iVar2 = findsetreg(p,iVar2,reg);
  *ppc = iVar2;
  if (iVar2 == -1) goto LAB_0010b0d9;
  uVar1 = p->code[iVar2];
  switch(uVar1 & 0x7f) {
  case 0:
    reg_00 = uVar1 >> 0x10 & 0xff;
    if (reg_00 < (uVar1 >> 7 & 0xff)) {
      pcVar3 = basicgetobjname(p,ppc,reg_00,name);
      return pcVar3;
    }
    goto LAB_0010b0d9;
  default:
LAB_0010b0d9:
    p_local = (Proto *)0x0;
    break;
  case 3:
    p_local = (Proto *)kname(p,uVar1 >> 0xf,name);
    break;
  case 4:
    p_local = (Proto *)kname(p,p->code[iVar2 + 1] >> 7,name);
    break;
  case 9:
    pcVar3 = upvalname(p,uVar1 >> 0x10 & 0xff);
    *name = pcVar3;
    p_local = (Proto *)anon_var_dwarf_4c46;
  }
  return (char *)p_local;
}

Assistant:

static const char *basicgetobjname (const Proto *p, int *ppc, int reg,
                                    const char **name) {
  int pc = *ppc;
  *name = luaF_getlocalname(p, reg + 1, pc);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  *ppc = pc = findsetreg(p, pc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return basicgetobjname(p, ppc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK: return kname(p, GETARG_Bx(i), name);
      case OP_LOADKX: return kname(p, GETARG_Ax(p->code[pc + 1]), name);
      default: break;
    }
  }
  return NULL;  /* could not find reasonable name */
}